

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

int dec_get_segment_id(AV1_COMMON *cm,uint8_t *segment_ids,int mi_offset,int x_mis,int y_mis)

{
  uint local_2c;
  int x;
  int y;
  int segment_id;
  int y_mis_local;
  int x_mis_local;
  int mi_offset_local;
  uint8_t *segment_ids_local;
  AV1_COMMON *cm_local;
  
  segment_id = 0x7fffffff;
  for (y = 0; y < y_mis; y = y + 1) {
    for (x = 0; x < x_mis; x = x + 1) {
      if ((uint)segment_id < (uint)segment_ids[mi_offset + y * (cm->mi_params).mi_cols + x]) {
        local_2c = segment_id;
      }
      else {
        local_2c = (uint)segment_ids[mi_offset + y * (cm->mi_params).mi_cols + x];
      }
      segment_id = local_2c;
    }
  }
  return segment_id;
}

Assistant:

static int dec_get_segment_id(const AV1_COMMON *cm, const uint8_t *segment_ids,
                              int mi_offset, int x_mis, int y_mis) {
  int segment_id = INT_MAX;

  for (int y = 0; y < y_mis; y++)
    for (int x = 0; x < x_mis; x++)
      segment_id = AOMMIN(
          segment_id, segment_ids[mi_offset + y * cm->mi_params.mi_cols + x]);

  assert(segment_id >= 0 && segment_id < MAX_SEGMENTS);
  return segment_id;
}